

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O2

void aq_enqueue_adu(aq_t *q,adu_t *adu)

{
  uint __line;
  void *__dest;
  dlist_t *pdVar1;
  char *__assertion;
  
  if (adu == (adu_t *)0x0) {
    __assertion = "adu != NULL";
    __line = 0x56;
  }
  else {
    __dest = malloc(0x5e60);
    if (__dest == (void *)0x0) {
      __assertion = "tmp_adu != NULL";
      __line = 0x59;
    }
    else {
      memcpy(__dest,adu,0x5e60);
      pdVar1 = dlist_ins_end(&q->adus,__dest);
      if (pdVar1 != (dlist_t *)0x0) {
        return;
      }
      __assertion = "dlist != NULL";
      __line = 0x5e;
    }
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                __line,"void aq_enqueue_adu(aq_t *, adu_t *)");
}

Assistant:

static void aq_enqueue_adu(aq_t *q, adu_t *adu) {
  assert(q   != NULL);
  assert(adu != NULL);

  adu_t *tmp_adu = malloc(sizeof(adu_t));
  assert(tmp_adu != NULL);

  memcpy(tmp_adu, adu, sizeof(adu_t));

  dlist_t *dlist = dlist_ins_end(&q->adus, tmp_adu);
  assert(dlist != NULL);
}